

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double get_removal_time(int mode,int num_decoded_frame,int decoder_buffer_delay,
                       FRAME_BUFFER *frame_buffer_pool,double current_time)

{
  FRAME_BUFFER *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  undefined8 local_8;
  
  if (in_EDI == 1) {
    local_8 = -1.0;
  }
  else {
    local_8 = time_next_buffer_is_free(in_ESI,in_EDX,in_RCX,in_XMM0_Qa);
  }
  return local_8;
}

Assistant:

static double get_removal_time(int mode, int num_decoded_frame,
                               int decoder_buffer_delay,
                               const FRAME_BUFFER *frame_buffer_pool,
                               double current_time) {
  if (mode == SCHEDULE_MODE) {
    assert(0 && "SCHEDULE_MODE IS NOT SUPPORTED YET");
    return INVALID_TIME;
  } else {
    return time_next_buffer_is_free(num_decoded_frame, decoder_buffer_delay,
                                    frame_buffer_pool, current_time);
  }
}